

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpFixed<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  unsigned_long uVar1;
  FieldEntry *entry;
  char *pcVar2;
  Nullable<const_char_*> failure_msg;
  void *x;
  unsigned_long *puVar3;
  ulong uVar4;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint *puVar5;
  ParseContext *ctx_00;
  ushort uVar6;
  uint uVar7;
  ushort uVar8;
  long lStack_80;
  unsigned_short local_52;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_50;
  FieldEntry *local_48;
  LogMessageFatal local_40;
  
  entry = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                    (table,(ulong)data.field_0 >> 0x20);
  uVar8 = entry->type_card & 0x30;
  if (uVar8 == 0x20) {
    pcVar2 = MpRepeatedFixed<true>(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  uVar6 = entry->type_card & 0x1c0;
  uVar7 = data.field_0._0_4_ & 7;
  if (uVar6 == 0xc0) {
    if (uVar7 != 1) {
LAB_001e9875:
      UNRECOVERED_JUMPTABLE = table->fallback;
      goto LAB_001e9920;
    }
  }
  else {
    local_52 = 0x80;
    local_50 = data.field_0;
    local_48 = entry;
    local_40.super_LogMessage.errno_saver_.saved_errno_._0_2_ = uVar6;
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                            ((unsigned_short *)&local_40,&local_52,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x77f,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    entry = local_48;
    data.field_0 = local_50;
    if (uVar7 != 5) goto LAB_001e9875;
  }
  if (uVar8 == 0x30) {
    ctx_00 = (ParseContext *)((ulong)data.field_0 >> 3 & 0x1fffffff);
    ChangeOneof(table,entry,(uint32_t)ctx_00,ctx_00,msg);
  }
  else if (uVar8 == 0x10) {
    anon_unknown_105::SetHas(entry,msg);
  }
  x = MaybeGetSplitBase(msg,true,table);
  if (uVar6 == 0xc0) {
    uVar1 = *(unsigned_long *)ptr;
    puVar3 = RefAt<unsigned_long>(x,(ulong)entry->offset);
    *puVar3 = uVar1;
    lStack_80 = 8;
  }
  else {
    uVar7 = *(uint *)ptr;
    puVar5 = RefAt<unsigned_int>(x,(ulong)entry->offset);
    *puVar5 = uVar7;
    lStack_80 = 4;
  }
  ptr = ptr + lStack_80;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar5 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar5 = *puVar5 | (uint)hasbits;
    }
    return (char *)(ushort *)ptr;
  }
  uVar7 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
  if ((uVar7 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar4 = (ulong)(uVar7 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar4);
LAB_001e9920:
  pcVar2 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar2;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpFixed(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing (wiretype fallback is handled there):
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  // Check for mismatched wiretype:
  const uint16_t rep = type_card & field_layout::kRepMask;
  const uint32_t decoded_wiretype = data.tag() & 7;
  if (rep == field_layout::kRep64Bits) {
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED64) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED32) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }
  // Set the field present:
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (card == field_layout::kFcOneof) {
    ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  // Copy the value:
  if (rep == field_layout::kRep64Bits) {
    RefAt<uint64_t>(base, entry.offset) = UnalignedLoad<uint64_t>(ptr);
    ptr += sizeof(uint64_t);
  } else {
    RefAt<uint32_t>(base, entry.offset) = UnalignedLoad<uint32_t>(ptr);
    ptr += sizeof(uint32_t);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}